

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  connectdata *pcVar2;
  connectdata *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  _Bool eos;
  size_t nread;
  
  pcVar2 = data->conn;
  *msg = (void *)0x0;
  if ((pcVar2->proto).ftpc.pp.sendbuf.allc == 0) {
    uVar5 = (pcVar2->proto).ftpc.pp.sendbuf.leng;
    if (uVar5 == 0) goto LAB_00152913;
    nread = 0x9000;
    if (uVar5 < 0x9000) {
      nread = uVar5;
    }
    CVar8 = Curl_client_read(data,(pcVar2->proto).smbc.send_buf,nread,&nread,&eos);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (nread == 0) {
      return CURLE_OK;
    }
    psVar1 = &(pcVar2->proto).ftpc.pp.sendbuf.leng;
    *psVar1 = *psVar1 - nread;
    (pcVar2->proto).ftpc.pp.sendbuf.allc = nread;
    (pcVar2->proto).ftpc.pp.sendbuf.toobig = 0;
  }
  pcVar3 = data->conn;
  sVar12 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
  if (sVar12 != 0) {
    sVar4 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
    sVar12 = sVar12 - sVar4;
    CVar8 = Curl_xfer_send(data,(pcVar3->proto).smbc.send_buf + sVar4,sVar12,false,&nread);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (nread == sVar12) {
      (pcVar3->proto).ftpc.pp.sendbuf.allc = 0;
    }
    else {
      psVar1 = &(pcVar3->proto).ftpc.pp.sendbuf.toobig;
      *psVar1 = *psVar1 + nread;
    }
  }
  if ((pcVar2->proto).ftpc.pp.sendbuf.allc != 0) {
    return CURLE_AGAIN;
  }
  if ((pcVar2->proto).ftpc.pp.sendbuf.leng != 0) {
    return CURLE_AGAIN;
  }
LAB_00152913:
  pcVar2 = data->conn;
  pcVar6 = (pcVar2->proto).smbc.recv_buf;
  pcVar9 = (pcVar2->proto).ftpc.pp.recvbuf.bufr;
  CVar8 = Curl_xfer_recv(data,pcVar6 + (long)pcVar9,0x9000 - (long)pcVar9,(ssize_t *)&nread);
  if (((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, nread != 0)) &&
     (pcVar9 = (pcVar2->proto).ftpc.pp.recvbuf.bufr + nread,
     (pcVar2->proto).ftpc.pp.recvbuf.bufr = pcVar9, (char *)0x3 < pcVar9)) {
    uVar7 = Curl_read16_be((uchar *)(pcVar6 + 2));
    if ((char *)((ulong)uVar7 + 4) <= (pcVar2->proto).ftpc.pp.recvbuf.bufr) {
      if (0x20 < uVar7) {
        uVar10 = (uint)(byte)pcVar6[0x24] * 2 + 0x27;
        uVar11 = (uint)(char *)((ulong)uVar7 + 4);
        if ((uVar10 <= uVar11) &&
           (uVar7 = Curl_read16_le((uchar *)(pcVar6 + (ulong)((uint)(byte)pcVar6[0x24] * 2) + 0x25))
           , uVar11 < uVar10 + uVar7)) {
          return CURLE_READ_ERROR;
        }
      }
      *msg = pcVar6;
    }
  }
  return CVar8;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}